

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O0

void __thiscall
webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::writeData
          (WebSocket<webfront::networking::TCPNetworkingTS> *this,
          Frame<webfront::networking::TCPNetworkingTS> *frame)

{
  basic_stream_socket<std::experimental::net::v1::ip::tcp> *in_RDI;
  Frame<webfront::networking::TCPNetworkingTS> *in_stack_ffffffffffffffa8;
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  *in_stack_ffffffffffffffc0;
  
  Frame<webfront::networking::TCPNetworkingTS>::toBuffers(in_stack_ffffffffffffffa8);
  networking::TCPNetworkingTS::
  AsyncWrite<std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>&,std::vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>,webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::writeData(webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>)::_lambda(std::error_code,unsigned_long)_1_>
            (in_RDI,(vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                     *)in_stack_ffffffffffffffa8,(completion_handler_type *)0x13c290);
  http::std::
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ::~vector(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void writeData(Frame<Net> frame) {
        Net::AsyncWrite(socket, frame.toBuffers(), [this](std::error_code ec, std::size_t /*bytesTransferred*/) {
            if (ec) {
                if (started) {
                    log::error("Error during write : ec.value() = {}", ec.value());
                    if (closeHandler) closeHandler(CloseEvent{static_cast<uint16_t>(ec.value()), ec.message()});
                    if (ec != Net::Error::OperationAborted) stop();
                }
            }
        });
    }